

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::Statistics::Statistics(Statistics *this)

{
  Statistics *this_local;
  
  this->numTriangleMeshes = 0;
  this->numTriangles = 0;
  this->numTriangleBytes = 0;
  this->numQuadMeshes = 0;
  this->numQuads = 0;
  this->numQuadBytes = 0;
  this->numSubdivMeshes = 0;
  this->numPatches = 0;
  this->numSubdivBytes = 0;
  this->numCurveSets = 0;
  this->numCurves = 0;
  this->numCurveBytes = 0;
  this->numGridMeshNodes = 0;
  this->numGrids = 0;
  this->numGridBytes = 0;
  this->numPointSets = 0;
  this->numPoints = 0;
  this->numPointBytes = 0;
  this->numTransformNodes = 0;
  this->numTransformedObjects = 0;
  this->numLights = 0;
  this->numCameras = 0;
  this->numMaterials = 0;
  return;
}

Assistant:

Statistics ()
      : numTriangleMeshes(0), numTriangles(0), numTriangleBytes(0),
        numQuadMeshes(0),     numQuads(0),     numQuadBytes(0),
        numSubdivMeshes(0),   numPatches(0),   numSubdivBytes(0),
        numCurveSets(0),      numCurves(0),    numCurveBytes(0),
        numGridMeshNodes(0),  numGrids(0),     numGridBytes(0),
        numPointSets(0),      numPoints(0),    numPointBytes(0),
        numTransformNodes(0),
        numTransformedObjects(0),
        numLights(0),
        numCameras(0),
        numMaterials(0) {}